

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_state_copy(LodePNGState *dest,LodePNGState *source)

{
  uint uVar1;
  
  lodepng_state_cleanup(dest);
  memcpy(dest,source,0x220);
  (dest->info_raw).key_defined = 0;
  (dest->info_raw).key_r = 0;
  (dest->info_raw).key_g = 0;
  (dest->info_raw).key_b = 0;
  (dest->info_raw).colortype = LCT_RGBA;
  (dest->info_raw).bitdepth = 8;
  (dest->info_raw).palette = (uchar *)0x0;
  (dest->info_raw).palettesize = 0;
  lodepng_info_init(&dest->info_png);
  uVar1 = lodepng_color_mode_copy(&dest->info_raw,&source->info_raw);
  dest->error = uVar1;
  if (uVar1 == 0) {
    uVar1 = lodepng_info_copy(&dest->info_png,&source->info_png);
    dest->error = uVar1;
  }
  return;
}

Assistant:

void lodepng_state_copy(LodePNGState* dest, const LodePNGState* source) {
  lodepng_state_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  dest->error = lodepng_color_mode_copy(&dest->info_raw, &source->info_raw); if(dest->error) return;
  dest->error = lodepng_info_copy(&dest->info_png, &source->info_png); if(dest->error) return;
}